

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

void __thiscall
CoreML::Specification::BiasLayerParams::_internal_add_shape(BiasLayerParams *this,uint64_t value)

{
  uint64_t local_8;
  
  local_8 = value;
  google::protobuf::RepeatedField<unsigned_long>::Add(&this->shape_,&local_8);
  return;
}

Assistant:

inline void BiasLayerParams::_internal_add_shape(uint64_t value) {
  shape_.Add(value);
}